

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_identity.cc
# Opt level: O1

void absl::base_internal::ClearCurrentThreadIdentity(void)

{
  void *pvVar1;
  
  if ((_ZN4absl13base_internal12_GLOBAL__N_123pthread_key_initializedE_0 & 1) != 0) {
    pvVar1 = pthread_getspecific((anonymous_namespace)::thread_identity_pthread_key);
    if (pvVar1 != (void *)0x0) {
      __assert_fail("CurrentThreadIdentityIfPresent() == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/base/internal/thread_identity.cc"
                    ,0x8b,"void absl::base_internal::ClearCurrentThreadIdentity()");
    }
  }
  return;
}

Assistant:

void ClearCurrentThreadIdentity() {
#if ABSL_THREAD_IDENTITY_MODE == ABSL_THREAD_IDENTITY_MODE_USE_TLS || \
    ABSL_THREAD_IDENTITY_MODE == ABSL_THREAD_IDENTITY_MODE_USE_CPP11
  thread_identity_ptr = nullptr;
#elif ABSL_THREAD_IDENTITY_MODE == \
      ABSL_THREAD_IDENTITY_MODE_USE_POSIX_SETSPECIFIC
  // pthread_setspecific expected to clear value on destruction
  assert(CurrentThreadIdentityIfPresent() == nullptr);
#endif
}